

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

bool __thiscall
llvm::DWARFUnitHeader::extract
          (DWARFUnitHeader *this,DWARFContext *Context,DWARFDataExtractor *debug_info,
          uint64_t *offset_ptr,DWARFSectionKind SectionKind,DWARFUnitIndex *Index,Entry *Entry)

{
  FormParams *this_00;
  ushort uVar1;
  ulong uVar2;
  uint8_t uVar3;
  byte bVar4;
  bool bVar5;
  uint16_t uVar6;
  Entry *pEVar7;
  uint64_t uVar8;
  SectionContribution *pSVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar8 = *offset_ptr;
  this->Offset = uVar8;
  this->IndexEntry = Entry;
  if (Index != (DWARFUnitIndex *)0x0 && Entry == (Entry *)0x0) {
    pEVar7 = DWARFUnitIndex::getFromOffset(Index,(uint32_t)uVar8);
    this->IndexEntry = pEVar7;
  }
  uVar8 = DWARFDataExtractor::getRelocatedValue
                    (debug_info,4,offset_ptr,(uint64_t *)0x0,(Error *)0x0);
  this->Length = uVar8;
  this_00 = &this->FormParams;
  (this->FormParams).Format = DWARF32;
  if (uVar8 == 0xffffffff) {
    uVar8 = DataExtractor::getU64(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
    this->Length = uVar8;
    (this->FormParams).Format = DWARF64;
  }
  uVar6 = DataExtractor::getU16(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
  this_00->Version = uVar6;
  if (uVar6 < 5) {
    bVar4 = dwarf::FormParams::getDwarfOffsetByteSize(this_00);
    uVar8 = DWARFDataExtractor::getRelocatedValue
                      (debug_info,(uint)bVar4,offset_ptr,(uint64_t *)0x0,(Error *)0x0);
    this->AbbrOffset = uVar8;
    uVar3 = DataExtractor::getU8(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
    (this->FormParams).AddrSize = uVar3;
    if (SectionKind == DW_SECT_TYPES) {
      this->UnitType = '\x02';
    }
    else {
      this->UnitType = '\x01';
    }
  }
  else {
    uVar3 = DataExtractor::getU8(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
    this->UnitType = uVar3;
    uVar3 = DataExtractor::getU8(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
    (this->FormParams).AddrSize = uVar3;
    bVar4 = dwarf::FormParams::getDwarfOffsetByteSize(this_00);
    uVar8 = DWARFDataExtractor::getRelocatedValue
                      (debug_info,(uint)bVar4,offset_ptr,(uint64_t *)0x0,(Error *)0x0);
    this->AbbrOffset = uVar8;
  }
  if (this->IndexEntry == (Entry *)0x0) {
LAB_00d9f16a:
    if ((this->UnitType & 0xfb) == 2) {
      uVar8 = DataExtractor::getU64(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
      this->TypeHash = uVar8;
      bVar4 = dwarf::FormParams::getDwarfOffsetByteSize(this_00);
      uVar8 = DataExtractor::getUnsigned
                        (&debug_info->super_DataExtractor,offset_ptr,(uint)bVar4,(Error *)0x0);
      this->TypeOffset = uVar8;
    }
    else if ((this->UnitType & 0xfe) == 4) {
      uVar8 = DataExtractor::getU64(&debug_info->super_DataExtractor,offset_ptr,(Error *)0x0);
      if ((this->DWOId).Storage.hasVal == false) {
        (this->DWOId).Storage.hasVal = true;
      }
      (this->DWOId).Storage.field_0.value = uVar8;
    }
    uVar10 = *offset_ptr - this->Offset;
    if (0xff < uVar10) {
      __assert_fail("*offset_ptr - Offset <= 255 && \"unexpected header size\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                    ,0x11c,
                    "bool llvm::DWARFUnitHeader::extract(DWARFContext &, const DWARFDataExtractor &, uint64_t *, DWARFSectionKind, const DWARFUnitIndex *, const DWARFUnitIndex::Entry *)"
                   );
    }
    this->Size = (uint8_t)uVar10;
    if ((this->UnitType & 0xfb) == 2) {
      uVar2 = this->TypeOffset;
      bVar11 = true;
      if (uVar10 <= uVar2) {
        uVar8 = this->Length;
        bVar4 = getUnitLengthFieldByteSize(this);
        bVar11 = bVar4 + uVar8 <= uVar2;
      }
    }
    else {
      bVar11 = false;
    }
    uVar8 = getNextUnitOffset(this);
    bVar5 = false;
    if ((((!bVar11) && (((this->FormParams).AddrSize - 4 & 0xfb) == 0)) &&
        (bVar5 = false, uVar8 - 1 < (debug_info->super_DataExtractor).Data.Length)) &&
       (uVar1 = (this->FormParams).Version, 0xfffffffb < uVar1 - 6)) {
      bVar5 = true;
      if (Context->MaxVersion < (uint)uVar1) {
        Context->MaxVersion = (uint)uVar1;
      }
    }
  }
  else {
    if (this->AbbrOffset == 0) {
      pSVar9 = DWARFUnitIndex::Entry::getOffset(this->IndexEntry);
      if ((pSVar9 != (SectionContribution *)0x0) && (this->Length + 4 == (ulong)pSVar9->Length)) {
        pSVar9 = DWARFUnitIndex::Entry::getOffset(this->IndexEntry,DW_SECT_ABBREV);
        if (pSVar9 != (SectionContribution *)0x0) {
          this->AbbrOffset = (ulong)pSVar9->Offset;
          goto LAB_00d9f16a;
        }
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool DWARFUnitHeader::extract(DWARFContext &Context,
                              const DWARFDataExtractor &debug_info,
                              uint64_t *offset_ptr,
                              DWARFSectionKind SectionKind,
                              const DWARFUnitIndex *Index,
                              const DWARFUnitIndex::Entry *Entry) {
  Offset = *offset_ptr;
  IndexEntry = Entry;
  if (!IndexEntry && Index)
    IndexEntry = Index->getFromOffset(*offset_ptr);
  Length = debug_info.getRelocatedValue(4, offset_ptr);
  FormParams.Format = DWARF32;
  if (Length == dwarf::DW_LENGTH_DWARF64) {
    Length = debug_info.getU64(offset_ptr);
    FormParams.Format = DWARF64;
  }
  FormParams.Version = debug_info.getU16(offset_ptr);
  if (FormParams.Version >= 5) {
    UnitType = debug_info.getU8(offset_ptr);
    FormParams.AddrSize = debug_info.getU8(offset_ptr);
    AbbrOffset = debug_info.getRelocatedValue(FormParams.getDwarfOffsetByteSize(), offset_ptr);
  } else {
    AbbrOffset = debug_info.getRelocatedValue(FormParams.getDwarfOffsetByteSize(), offset_ptr);
    FormParams.AddrSize = debug_info.getU8(offset_ptr);
    // Fake a unit type based on the section type.  This isn't perfect,
    // but distinguishing compile and type units is generally enough.
    if (SectionKind == DW_SECT_TYPES)
      UnitType = DW_UT_type;
    else
      UnitType = DW_UT_compile;
  }
  if (IndexEntry) {
    if (AbbrOffset)
      return false;
    auto *UnitContrib = IndexEntry->getOffset();
    if (!UnitContrib || UnitContrib->Length != (Length + 4))
      return false;
    auto *AbbrEntry = IndexEntry->getOffset(DW_SECT_ABBREV);
    if (!AbbrEntry)
      return false;
    AbbrOffset = AbbrEntry->Offset;
  }
  if (isTypeUnit()) {
    TypeHash = debug_info.getU64(offset_ptr);
    TypeOffset =
        debug_info.getUnsigned(offset_ptr, FormParams.getDwarfOffsetByteSize());
  } else if (UnitType == DW_UT_split_compile || UnitType == DW_UT_skeleton)
    DWOId = debug_info.getU64(offset_ptr);

  // Header fields all parsed, capture the size of this unit header.
  assert(*offset_ptr - Offset <= 255 && "unexpected header size");
  Size = uint8_t(*offset_ptr - Offset);

  // Type offset is unit-relative; should be after the header and before
  // the end of the current unit.
  bool TypeOffsetOK =
      !isTypeUnit()
          ? true
          : TypeOffset >= Size &&
                TypeOffset < getLength() + getUnitLengthFieldByteSize();
  bool LengthOK = debug_info.isValidOffset(getNextUnitOffset() - 1);
  bool VersionOK = DWARFContext::isSupportedVersion(getVersion());
  bool AddrSizeOK = getAddressByteSize() == 4 || getAddressByteSize() == 8;

  if (!LengthOK || !VersionOK || !AddrSizeOK || !TypeOffsetOK)
    return false;

  // Keep track of the highest DWARF version we encounter across all units.
  Context.setMaxVersionIfGreater(getVersion());
  return true;
}